

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmanager.cpp
# Opt level: O1

void __thiscall mwheel::DLManager::unload_library(DLManager *this,path *library_path)

{
  int iVar1;
  iterator __position;
  char *pcVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  stringstream estream;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  __position = std::
               _Rb_tree<boost::filesystem::path,_std::pair<const_boost::filesystem::path,_void_*>,_std::_Select1st<std::pair<const_boost::filesystem::path,_void_*>_>,_std::less<boost::filesystem::path>,_std::allocator<std::pair<const_boost::filesystem::path,_void_*>_>_>
               ::find((_Rb_tree<boost::filesystem::path,_std::pair<const_boost::filesystem::path,_void_*>,_std::_Select1st<std::pair<const_boost::filesystem::path,_void_*>_>,_std::less<boost::filesystem::path>,_std::allocator<std::pair<const_boost::filesystem::path,_void_*>_>_>
                       *)this,library_path);
  if (__position._M_node == (_Base_ptr)&this->field_0x8) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,
               "ERROR : cannot trying to unload a shared library that was not previously loaded ",
               0x50);
    pbVar3 = boost::filesystem::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)local_198,library_path);
    std::endl<char,std::char_traits<char>>((ostream *)pbVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"\tDid you use a wrong name for the library to be unloaded?",0x39);
    std::endl<char,std::char_traits<char>>(local_198);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,asStack_1c8);
    *(undefined ***)prVar5 = &PTR__runtime_error_00106d00;
    __cxa_throw(prVar5,&library_not_loaded::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = dlclose(*(undefined8 *)(__position._M_node + 2));
  if (iVar1 == 0) {
    std::
    _Rb_tree<boost::filesystem::path,_std::pair<const_boost::filesystem::path,_void_*>,_std::_Select1st<std::pair<const_boost::filesystem::path,_void_*>_>,_std::less<boost::filesystem::path>,_std::allocator<std::pair<const_boost::filesystem::path,_void_*>_>_>
    ::_M_erase_aux((_Rb_tree<boost::filesystem::path,_std::pair<const_boost::filesystem::path,_void_*>,_std::_Select1st<std::pair<const_boost::filesystem::path,_void_*>_>,_std::less<boost::filesystem::path>,_std::allocator<std::pair<const_boost::filesystem::path,_void_*>_>_>
                    *)this,(const_iterator)__position._M_node);
    return;
  }
  pcVar2 = (char *)dlerror();
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"ERROR : cannot unload shared library ",0x25);
  pbVar3 = boost::filesystem::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)local_198,library_path);
  std::endl<char,std::char_traits<char>>((ostream *)pbVar3);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"\t",1);
  poVar4 = std::operator<<(local_198,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar4);
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar5,asStack_1c8);
  *(undefined ***)prVar5 = &PTR__runtime_error_00106d28;
  __cxa_throw(prVar5,&error_unloading_dynamic_library::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DLManager::unload_library(const boost::filesystem::path &library_path) {
#ifdef BOOST_OS_UNIX
  auto it = DLMap::iterator(m_dl_map.find(library_path));
  // The library was not found
  if (it == m_dl_map.end()) {
    stringstream estream;
    estream << "ERROR : cannot trying to unload a shared library that was not previously loaded "
            << library_path << endl;
    estream << "\tDid you use a wrong name for the library to be unloaded?" << endl;
    throw library_not_loaded(estream.str());
  }
  // Close the library
  if (dlclose(it->second)) {
    auto error_message = dlerror();
    stringstream estream;
    estream << "ERROR : cannot unload shared library " << library_path << endl;
    estream << "\t" << error_message << endl;
    throw error_unloading_dynamic_library(estream.str());
  }
  m_dl_map.erase(it);
#endif
}